

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1785d::IDLExportVisitor::visit_
          (IDLExportVisitor *this,Compound *type,Field *field)

{
  ostream *poVar1;
  Type *type_00;
  string local_60;
  string local_40;
  Field *local_20;
  Field *field_local;
  Compound *type_local;
  IDLExportVisitor *this_local;
  
  local_20 = field;
  field_local = (Field *)type;
  type_local = (Compound *)this;
  poVar1 = std::operator<<((ostream *)&this->m_stream,(string *)&this->m_indent);
  type_00 = (Type *)Typelib::Field::getType();
  Typelib::Field::getName_abi_cxx11_();
  getIDLAbsolute(&local_40,this,type_00,&local_60);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,";\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return true;
}

Assistant:

bool IDLExportVisitor::visit_(Compound const& type, Field const& field)
    {
        m_stream
            << m_indent
            << getIDLAbsolute(field.getType(), field.getName())
            << ";\n";

        return true;
    }